

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O2

TermList __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Applicator::
apply(Applicator *this,uint var)

{
  bool bVar1;
  uint uVar2;
  TermList *in_RAX;
  TermList TVar3;
  TermList *cacheEntry;
  TermList *local_18;
  
  local_18 = in_RAX;
  bVar1 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
          getValuePtr(&this->_cache,var,&local_18);
  if (bVar1) {
    uVar2 = Kernel::Renaming::get(this->_resultNormalizer,var);
    TVar3._content =
         (this->_parent->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array
         [uVar2]._obj._content;
    local_18->_content = TVar3._content;
  }
  else {
    TVar3._content = local_18->_content;
  }
  return (TermList)TVar3._content;
}

Assistant:

TermList apply(unsigned var)
  {
    TermList* cacheEntry;
    if(_cache.getValuePtr(var,cacheEntry)) {
      ASS(_resultNormalizer->contains(var));
      unsigned nvar=_resultNormalizer->get(var);
      ASS(_parent->_bindings.find(nvar));
      *cacheEntry=_parent->_bindings.get(nvar);
    }
    return *cacheEntry;
  }